

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_layout_helper.cc
# Opt level: O2

array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
* google::protobuf::compiler::cpp::MessageLayoutHelper::ConsolidateAlignedFieldGroups
            (array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
             *__return_storage_ptr__,
            array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
            *field_groups,size_t alignment,size_t target_alignment)

{
  ulong uVar1;
  Nonnull<const_char_*> failure_msg;
  ulong uVar2;
  long lVar3;
  int line;
  long lVar4;
  size_t j;
  ulong uVar5;
  long lVar6;
  long *plVar7;
  array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
  *partitions_aligned_to_target;
  FieldGroup field_group;
  FieldGroup local_78;
  array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
  *local_50;
  size_type local_48;
  long local_40;
  unsigned_long local_38;
  
  local_78.fields_.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)target_alignment;
  local_50 = field_groups;
  local_38 = alignment;
  failure_msg = absl::lts_20250127::log_internal::Check_GTImpl<unsigned_long,unsigned_long>
                          ((unsigned_long *)&local_78,&local_38,"target_alignment > alignment");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    uVar2 = target_alignment / alignment;
    local_78.fields_.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(target_alignment % alignment);
    local_38 = 0;
    failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                            ((unsigned_long *)&local_78,&local_38,
                             "target_alignment % alignment == size_t{0}");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      memset(__return_storage_ptr__,0,0x90);
      local_48 = (uVar2 + 5) / uVar2;
      for (local_40 = 0; local_40 != 6; local_40 = local_40 + 1) {
        lVar6 = local_40 * 0x18;
        std::
        vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
        ::reserve((vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
                   *)(&__return_storage_ptr__->field_0x0 + lVar6),local_48);
        plVar7 = (long *)(&local_50->field_0x0 + lVar6);
        std::
        __stable_sort<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldGroup*,std::vector<google::protobuf::compiler::cpp::FieldGroup,std::allocator<google::protobuf::compiler::cpp::FieldGroup>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (*plVar7,plVar7[1]);
        uVar5 = 0;
        while( true ) {
          lVar4 = *plVar7;
          lVar3 = plVar7[1];
          if ((ulong)(lVar3 - lVar4 >> 5) <= uVar5) break;
          local_78.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_78.preferred_location_ = 0.0;
          local_78.estimated_memory_size_ = 0;
          local_78.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          uVar1 = uVar5 + uVar2;
          for (; (uVar5 < uVar1 && (uVar5 < (ulong)(lVar3 - lVar4 >> 5))); uVar5 = uVar5 + 1) {
            FieldGroup::UpdatePreferredLocationAndInsertOtherFields
                      (&local_78,(FieldGroup *)(lVar4 + uVar5 * 0x20));
            lVar4 = *plVar7;
            lVar3 = plVar7[1];
          }
          std::
          vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
          ::push_back((vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
                       *)(&__return_storage_ptr__->field_0x0 + lVar6),&local_78);
          std::
          _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::~_Vector_base((_Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           *)&local_78);
          uVar5 = uVar1;
        }
      }
      return __return_storage_ptr__;
    }
    line = 0x117;
  }
  else {
    line = 0x116;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message_layout_helper.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_78);
}

Assistant:

std::array<std::vector<FieldGroup>, MessageLayoutHelper::kMaxHotness>
MessageLayoutHelper::ConsolidateAlignedFieldGroups(
    std::array<std::vector<FieldGroup>, kMaxHotness>& field_groups,
    size_t alignment, size_t target_alignment) {
  ABSL_CHECK_GT(target_alignment, alignment);
  ABSL_CHECK_EQ(target_alignment % alignment, size_t{0});

  const size_t size_inflation = target_alignment / alignment;
  std::array<std::vector<FieldGroup>, kMaxHotness> partitions_aligned_to_target;

  for (size_t h = 0; h < kMaxHotness; ++h) {
    auto& partition = field_groups[h];
    auto& target_partition = partitions_aligned_to_target[h];
    target_partition.reserve((field_groups.size() + size_inflation - 1) /
                             size_inflation);

    // Using stable_sort ensures that the output is consistent across runs.
    std::stable_sort(partition.begin(), partition.end());

    // Group fields into groups of `size_inflation` fields, which will be
    // aligned to `target_alignment`.
    for (size_t i = 0; i < partition.size(); i += size_inflation) {
      FieldGroup field_group;
      for (size_t j = i; j < partition.size() && j < i + size_inflation; ++j) {
        field_group.Append(partition[j]);
      }
      target_partition.push_back(field_group);
    }
  }

  return partitions_aligned_to_target;
}